

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitInvoke(RegSlot location,RegSlot callObjLocation,PropertyId propertyId,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  ProfileId callSiteId_00;
  ByteCodeWriter *pBVar1;
  ProfileId callSiteId;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  PropertyId propertyId_local;
  RegSlot callObjLocation_local;
  RegSlot location_local;
  
  EmitMethodFld(false,false,location,callObjLocation,propertyId,byteCodeGenerator,funcInfo,true);
  FuncInfo::StartRecordingOutArgs(funcInfo,1);
  callSiteId_00 = ByteCodeGenerator::GetNextCallSiteId(byteCodeGenerator,CallI);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::StartCall(pBVar1,StartCall,1);
  EmitArgListStart(callObjLocation,byteCodeGenerator,funcInfo,callSiteId_00);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::CallI(pBVar1,CallI,location,location,1,callSiteId_00,CallFlags_None);
  return;
}

Assistant:

void EmitInvoke(
    Js::RegSlot location,
    Js::RegSlot callObjLocation,
    Js::PropertyId propertyId,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    EmitMethodFld(false, false, location, callObjLocation, propertyId, byteCodeGenerator, funcInfo);

    funcInfo->StartRecordingOutArgs(1);

    Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(Js::OpCode::CallI);

    byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, 1);
    EmitArgListStart(callObjLocation, byteCodeGenerator, funcInfo, callSiteId);

    byteCodeGenerator->Writer()->CallI(Js::OpCode::CallI, location, location, 1, callSiteId);
}